

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O2

bool RigidBodyDynamics::Math::SpatialVectorCompareEpsilon
               (SpatialVector *vector_a,SpatialVector *vector_b,double epsilon)

{
  ulong uVar1;
  ulong uVar2;
  ostream *poVar3;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 6) goto LAB_0010bd0b;
    uVar1 = uVar2 + 1;
  } while (ABS((vector_a->super_Matrix<double,_6,_1,_0,_6,_1>).
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
               [uVar2] - (vector_b->super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                         m_data.array[uVar2]) < epsilon);
  poVar3 = std::operator<<((ostream *)&std::cerr,"Expected:");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = Eigen::operator<<(poVar3,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)vector_a);
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar3,"but was");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = Eigen::operator<<(poVar3,(DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)vector_b);
  std::endl<char,std::char_traits<char>>(poVar3);
LAB_0010bd0b:
  return 5 < uVar2;
}

Assistant:

RBDL_DLLAPI
bool SpatialVectorCompareEpsilon (const SpatialVector &vector_a, const SpatialVector &vector_b, double epsilon) {
	assert (epsilon >= 0.);
	unsigned int i;

	for (i = 0; i < 6; i++) {
		if (fabs(vector_a[i] - vector_b[i]) >= epsilon) {
			std::cerr << "Expected:" 
				<< std::endl << vector_a << std::endl
				<< "but was" << std::endl 
				<< vector_b << std::endl;
			return false;
		}
	}

	return true;
}